

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

VirtualInterfaceType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::VirtualInterfaceType,slang::ast::InstanceSymbol&,slang::ast::ModportSymbol_const*&,bool,slang::SourceLocation&>
          (BumpAllocator *this,InstanceSymbol *args,ModportSymbol **args_1,bool *args_2,
          SourceLocation *args_3)

{
  VirtualInterfaceType *pVVar1;
  size_t in_RCX;
  ModportSymbol *in_RDX;
  InstanceSymbol *in_RSI;
  VirtualInterfaceType *in_RDI;
  size_t in_R8;
  SourceLocation unaff_retaddr;
  
  pVVar1 = (VirtualInterfaceType *)allocate((BumpAllocator *)in_RDX,in_RCX,in_R8);
  ast::VirtualInterfaceType::VirtualInterfaceType
            (in_RDI,in_RSI,in_RDX,SUB81(in_RCX >> 0x38,0),unaff_retaddr);
  return pVVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }